

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qthreadpool.cpp
# Opt level: O0

void __thiscall QThreadPoolPrivate::clear(QThreadPoolPrivate *this)

{
  long lVar1;
  bool bVar2;
  value_type this_00;
  QRunnable *this_01;
  long in_FS_OFFSET;
  QRunnable *r;
  QueuePage *page;
  QMutexLocker<QMutex> locker;
  QMutex *in_stack_ffffffffffffff78;
  QueuePage *in_stack_ffffffffffffff80;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QMutexLocker<QMutex>::QMutexLocker
            ((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  while (bVar2 = QList<QueuePage_*>::isEmpty((QList<QueuePage_*> *)0x6cb4e2),
        ((bVar2 ^ 0xffU) & 1) != 0) {
    this_00 = QList<QueuePage_*>::takeLast((QList<QueuePage_*> *)in_stack_ffffffffffffff80);
    while (bVar2 = QueuePage::isFinished(this_00), ((bVar2 ^ 0xffU) & 1) != 0) {
      this_01 = QueuePage::pop(in_stack_ffffffffffffff80);
      if ((this_01 != (QRunnable *)0x0) && (bVar2 = QRunnable::autoDelete(this_01), bVar2)) {
        QMutexLocker<QMutex>::unlock((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80);
        if (this_01 != (QRunnable *)0x0) {
          (*this_01->_vptr_QRunnable[2])();
        }
        QMutexLocker<QMutex>::relock((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80);
      }
    }
    if (this_00 != (value_type)0x0) {
      operator_delete(this_00,0x810);
    }
  }
  QMutexLocker<QMutex>::~QMutexLocker((QMutexLocker<QMutex> *)in_stack_ffffffffffffff80);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QThreadPoolPrivate::clear()
{
    QMutexLocker locker(&mutex);
    while (!queue.isEmpty()) {
        auto *page = queue.takeLast();
        while (!page->isFinished()) {
            QRunnable *r = page->pop();
            if (r && r->autoDelete()) {
                locker.unlock();
                delete r;
                locker.relock();
            }
        }
        delete page;
    }
}